

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UFS.h
# Opt level: O3

void __thiscall UFS::UFS(UFS *this,int N)

{
  undefined1 auVar1 [16];
  int *__s;
  ulong uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  this->N = N;
  uVar2 = 0xffffffffffffffff;
  if (-1 < N) {
    uVar2 = (long)N * 4;
  }
  __s = (int *)operator_new__(uVar2);
  memset(__s,0,uVar2);
  (this->fa)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = __s;
  auVar1 = _DAT_0010b180;
  if (0 < N) {
    lVar3 = (long)N + -1;
    auVar4._8_4_ = (int)lVar3;
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = (int)((ulong)lVar3 >> 0x20);
    uVar2 = 0;
    auVar4 = auVar4 ^ _DAT_0010b180;
    auVar5 = _DAT_0010b170;
    do {
      auVar6 = auVar5 ^ auVar1;
      if ((bool)(~(auVar6._4_4_ == auVar4._4_4_ && auVar4._0_4_ < auVar6._0_4_ ||
                  auVar4._4_4_ < auVar6._4_4_) & 1)) {
        __s[uVar2] = (int)uVar2;
      }
      if ((auVar6._12_4_ != auVar4._12_4_ || auVar6._8_4_ <= auVar4._8_4_) &&
          auVar6._12_4_ <= auVar4._12_4_) {
        __s[uVar2 + 1] = (int)uVar2 + 1;
      }
      uVar2 = uVar2 + 2;
      lVar3 = auVar5._8_8_;
      auVar5._0_8_ = auVar5._0_8_ + 2;
      auVar5._8_8_ = lVar3 + 2;
    } while ((N + 1U & 0xfffffffe) != uVar2);
  }
  return;
}

Assistant:

UFS(int N) : N(N), fa(std::make_unique<int[]>(N))
	{ reset(); }